

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::syntax::CaseItemSyntax_*>::reallocateTo
          (SmallVectorBase<slang::syntax::CaseItemSyntax_*> *this,size_type newCapacity)

{
  CaseItemSyntax **__last;
  EVP_PKEY_CTX *ctx;
  CaseItemSyntax **in_RSI;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> *in_RDI;
  pointer newData;
  
  __last = (CaseItemSyntax **)operator_new(0x73dab6);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::syntax::CaseItemSyntax**,slang::syntax::CaseItemSyntax**>
            (in_RSI,__last,(CaseItemSyntax **)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }